

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int open_pty(char *prefix,int idx)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  char *slavename;
  termios options;
  char symname [128];
  int oflags;
  int fd;
  int idx_local;
  char *prefix_local;
  
  prefix_local._4_4_ = open("/dev/ptmx",0x902);
  if (prefix_local._4_4_ < 0) {
    if ((loglevel & 1U) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      syslog(3,"/dev/ptmx: %s",pcVar3);
    }
    prefix_local._4_4_ = -1;
  }
  else {
    grantpt(prefix_local._4_4_);
    unlockpt(prefix_local._4_4_);
    pcVar3 = ptsname(prefix_local._4_4_);
    snprintf((char *)&options.c_ispeed,0x80,"%s%d",prefix,(ulong)(uint)idx);
    unlink((char *)&options.c_ispeed);
    iVar1 = symlink(pcVar3,(char *)&options.c_ispeed);
    if ((iVar1 != 0) && ((loglevel & 1U) != 0)) {
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      syslog(3,"Symbolic link %s -> %s: %s.\n",&options.c_ispeed,pcVar3,pcVar4);
    }
    tcgetattr(prefix_local._4_4_,(termios *)((long)&slavename + 4));
    cfmakeraw((termios *)((long)&slavename + 4));
    tcsetattr(prefix_local._4_4_,0,(termios *)((long)&slavename + 4));
  }
  return prefix_local._4_4_;
}

Assistant:

int open_pty(const char *prefix, int idx) 
{
    int fd, oflags;
    char symname[128];
    struct termios options;
#if __QNX__
    int slave;
    char slavename[128];
    if(openpty(&fd, &slave, slavename, NULL, NULL) < 0) {
        LOGE("openpty: %s", strerror(errno));
        return -1;
    }
#else
    char *slavename;
    fd = open("/dev/ptmx", O_RDWR | O_NOCTTY | O_NONBLOCK);
    if(fd < 0) {
        LOGE("/dev/ptmx: %s", strerror(errno));
        return -1;
    }
	grantpt(fd); /* change permission of slave */
	unlockpt(fd); /* unlock slave */
	slavename = ptsname(fd); /* get name of slave */
#endif

    snprintf(symname, sizeof(symname), "%s%d", prefix, idx);
    unlink(symname);
    if (symlink(slavename, symname) != 0) {
        LOGE("Symbolic link %s -> %s: %s.\n", symname, slavename, strerror(errno));
    }

    // get the parameters
    tcgetattr(fd, &options);
    cfmakeraw(&options);

    tcsetattr(fd, TCSANOW, &options);

    //oflags = fcntl(fd, F_GETFL);
    //oflags |= (O_NONBLOCK | O_NOCTTY);
    //fcntl(fd, F_SETFL, oflags);

    return fd;
}